

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

DoubleFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_doubletype(FeatureType *this)

{
  bool bVar1;
  DoubleFeatureType *this_00;
  FeatureType *this_local;
  
  bVar1 = has_doubletype(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_doubletype(this);
    this_00 = (DoubleFeatureType *)operator_new(0x18);
    DoubleFeatureType::DoubleFeatureType(this_00);
    (this->Type_).doubletype_ = this_00;
  }
  return (DoubleFeatureType *)(this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::DoubleFeatureType* FeatureType::mutable_doubletype() {
  if (!has_doubletype()) {
    clear_Type();
    set_has_doubletype();
    Type_.doubletype_ = new ::CoreML::Specification::DoubleFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.doubleType)
  return Type_.doubletype_;
}